

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# epoch.cpp
# Opt level: O1

timestamp_t duckdb::EpochSecOperator::Operation<double,duckdb::timestamp_t>(double sec)

{
  bool bVar1;
  ConversionException *this;
  int64_t result;
  int64_t local_48;
  string local_40;
  
  bVar1 = TryCast::Operation<double,long>(sec * 1000000.0,&local_48,false);
  if (bVar1) {
    return (timestamp_t)local_48;
  }
  this = (ConversionException *)__cxa_allocate_exception(0x10);
  local_40._M_dataplus._M_p = (pointer)&local_40.field_2;
  ::std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_40,"Epoch seconds out of range for TIMESTAMP WITH TIME ZONE","");
  ConversionException::ConversionException(this,&local_40);
  __cxa_throw(this,&ConversionException::typeinfo,::std::runtime_error::~runtime_error);
}

Assistant:

static RESULT_TYPE Operation(INPUT_TYPE sec) {
		int64_t result;
		if (!TryCast::Operation(sec * Interval::MICROS_PER_SEC, result)) {
			throw ConversionException("Epoch seconds out of range for TIMESTAMP WITH TIME ZONE");
		}
		return timestamp_t(result);
	}